

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<const_kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&> __thiscall
kj::
Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
::find<0ul,unsigned_long&>
          (Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
           *this,unsigned_long *params)

{
  HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  Entry *t;
  ArrayPtr<const_kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> AVar3;
  Entry *local_50;
  unsigned_long *local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> pos;
  unsigned_long *params_local;
  Table<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
  *this_local;
  
  pos.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)params;
  pHVar1 = get<0ul,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>const&>
                     ((HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks> *)
                      (this + 0x20));
  AVar3 = Vector<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::asPtr
                    ((Vector<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)this);
  fwd<unsigned_long&>((unsigned_long *)pos.field_1);
  local_50 = AVar3.ptr;
  local_48 = (unsigned_long *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (Entry *)pHVar1;
  HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
  find<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry_const,unsigned_long&>
            ((HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *)&local_40,
             AVar3,local_48);
  other = _::readMaybe<unsigned_long>(&local_40);
  _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other);
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<const_kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&>::Maybe
              ((Maybe<const_kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&> *)
               &this_local,(void *)0x0);
  }
  else {
    puVar2 = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::operator[]
                  ((Vector<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)this,*puVar2)
    ;
    Maybe<const_kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&>::Maybe
              ((Maybe<const_kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&> *)
               &this_local,t);
  }
  _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<const_kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&>)
         (Entry *)this_local;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}